

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-unwrap.cpp
# Opt level: O0

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  int iVar1;
  long lVar2;
  char *pcVar3;
  allocator<char> local_c1;
  string local_c0 [39];
  allocator<char> local_99;
  string local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  uint local_38 [2];
  ui32_t length;
  int local_24;
  char **ppcStack_20;
  int i;
  char **argv_local;
  CommandOptions *pCStack_10;
  int argc_local;
  CommandOptions *this_local;
  
  this->mode = MMT_EXTRACT;
  this->error_flag = true;
  this->key_flag = false;
  this->read_hmac = false;
  this->split_wav = false;
  this->mono_wav = false;
  this->verbose_flag = false;
  this->fb_dump_size = 0;
  this->no_write_flag = false;
  this->version_flag = false;
  this->help_flag = false;
  this->stereo_image_flag = false;
  this->number_width = 6;
  this->start_frame = 0;
  this->duration = 0xffffffff;
  this->duration_flag = false;
  this->j2c_pedantic = true;
  this->picture_rate = 0x18;
  this->fb_size = 0x400000;
  this->file_prefix = (char *)0x0;
  this->channel_fmt = CF_NONE;
  this->input_filename = (char *)0x0;
  ppcStack_20 = argv;
  argv_local._4_4_ = argc;
  pCStack_10 = this;
  std::__cxx11::string::string((string *)&this->prefix_buffer);
  this->extension = "dcdata";
  memset(this->key_value,0,0x10);
  memset(this->key_id_value,0,0x10);
  local_24 = 1;
  do {
    if (argv_local._4_4_ <= local_24) {
      if (((this->help_flag & 1U) == 0) && ((this->version_flag & 1U) == 0)) {
        if (((this->mode == MMT_EXTRACT) || (this->mode == MMT_GOP_START)) &&
           (this->input_filename == (char *)0x0)) {
          fputs("Option requires at least one filename argument.\n",_stderr);
        }
        else {
          if ((this->mode == MMT_EXTRACT) && (this->file_prefix == (char *)0x0)) {
            pcVar3 = this->input_filename;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_98,pcVar3,&local_99);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>(local_c0,"",&local_c1);
            Kumu::PathSetExtension((string *)&local_78,local_98);
            std::operator+(&local_58,&local_78,"_");
            std::__cxx11::string::operator=((string *)&this->prefix_buffer,(string *)&local_58);
            std::__cxx11::string::~string((string *)&local_58);
            std::__cxx11::string::~string((string *)&local_78);
            std::__cxx11::string::~string(local_c0);
            std::allocator<char>::~allocator(&local_c1);
            std::__cxx11::string::~string(local_98);
            std::allocator<char>::~allocator(&local_99);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            this->file_prefix = pcVar3;
          }
          this->error_flag = false;
        }
      }
      return;
    }
    iVar1 = strcmp(ppcStack_20[local_24],"-help");
    if (iVar1 == 0) {
      this->help_flag = true;
    }
    else if ((*ppcStack_20[local_24] == '-') &&
            (((iVar1 = isalpha((int)ppcStack_20[local_24][1]), iVar1 != 0 ||
              (iVar1 = isdigit((int)ppcStack_20[local_24][1]), iVar1 != 0)) &&
             (ppcStack_20[local_24][2] == '\0')))) {
      switch(ppcStack_20[local_24][1]) {
      case '1':
        this->mono_wav = true;
        break;
      case '2':
        this->split_wav = true;
        break;
      case '3':
        this->stereo_image_flag = true;
        break;
      default:
        fprintf(_stderr,"Unrecognized option: %s\n",ppcStack_20[local_24]);
        return;
      case 'G':
        this->mode = MMT_GOP_START;
        break;
      case 'V':
        this->version_flag = true;
        break;
      case 'W':
        this->no_write_flag = true;
        break;
      case 'Z':
        this->j2c_pedantic = false;
        break;
      case 'b':
        local_24 = local_24 + 1;
        if ((argv_local._4_4_ <= local_24) || (*ppcStack_20[local_24] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x62);
          return;
        }
        lVar2 = strtol(ppcStack_20[local_24],(char **)0x0,10);
        lVar2 = Kumu::xabs<long>(lVar2);
        this->fb_size = (ui32_t)lVar2;
        break;
      case 'd':
        local_24 = local_24 + 1;
        if ((argv_local._4_4_ <= local_24) || (*ppcStack_20[local_24] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",100);
          return;
        }
        this->duration_flag = true;
        lVar2 = strtol(ppcStack_20[local_24],(char **)0x0,10);
        lVar2 = Kumu::xabs<long>(lVar2);
        this->duration = (ui32_t)lVar2;
        break;
      case 'e':
        local_24 = local_24 + 1;
        if ((argv_local._4_4_ <= local_24) || (*ppcStack_20[local_24] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x65);
          return;
        }
        this->extension = ppcStack_20[local_24];
        break;
      case 'f':
        local_24 = local_24 + 1;
        if ((argv_local._4_4_ <= local_24) || (*ppcStack_20[local_24] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x66);
          return;
        }
        lVar2 = strtol(ppcStack_20[local_24],(char **)0x0,10);
        lVar2 = Kumu::xabs<long>(lVar2);
        this->start_frame = (ui32_t)lVar2;
        break;
      case 'h':
        this->help_flag = true;
        break;
      case 'k':
        this->key_flag = true;
        local_24 = local_24 + 1;
        if ((argv_local._4_4_ <= local_24) || (*ppcStack_20[local_24] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x6b);
          return;
        }
        Kumu::hex2bin(ppcStack_20[local_24],this->key_value,0x10,local_38);
        if (local_38[0] != 0x10) {
          fprintf(_stderr,"Unexpected key length: %u, expecting %u characters.\n",(ulong)local_38[0]
                  ,0x10);
          return;
        }
        break;
      case 'm':
        this->read_hmac = true;
        break;
      case 'p':
        local_24 = local_24 + 1;
        if ((argv_local._4_4_ <= local_24) || (*ppcStack_20[local_24] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x70);
          return;
        }
        lVar2 = strtol(ppcStack_20[local_24],(char **)0x0,10);
        lVar2 = Kumu::xabs<long>(lVar2);
        this->picture_rate = (ui32_t)lVar2;
        break;
      case 's':
        local_24 = local_24 + 1;
        if ((argv_local._4_4_ <= local_24) || (*ppcStack_20[local_24] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x73);
          return;
        }
        lVar2 = strtol(ppcStack_20[local_24],(char **)0x0,10);
        lVar2 = Kumu::xabs<long>(lVar2);
        this->fb_dump_size = (ui32_t)lVar2;
        break;
      case 'v':
        this->verbose_flag = true;
        break;
      case 'w':
        local_24 = local_24 + 1;
        if ((argv_local._4_4_ <= local_24) || (*ppcStack_20[local_24] == '-')) {
          fprintf(_stderr,"Argument not found for option -%c.\n",0x77);
          return;
        }
        lVar2 = strtol(ppcStack_20[local_24],(char **)0x0,10);
        lVar2 = Kumu::xabs<long>(lVar2);
        this->number_width = (ui32_t)lVar2;
        break;
      case 'z':
        this->j2c_pedantic = true;
      }
    }
    else {
      if (*ppcStack_20[local_24] == '-') {
        fprintf(_stderr,"Unrecognized argument: %s\n",ppcStack_20[local_24]);
        return;
      }
      if (this->input_filename == (char *)0x0) {
        this->input_filename = ppcStack_20[local_24];
      }
      else if (this->file_prefix == (char *)0x0) {
        this->file_prefix = ppcStack_20[local_24];
      }
    }
    local_24 = local_24 + 1;
  } while( true );
}

Assistant:

CommandOptions(int argc, const char** argv) :
    mode(MMT_EXTRACT), error_flag(true), key_flag(false), read_hmac(false), split_wav(false),
    mono_wav(false), verbose_flag(false), fb_dump_size(0), no_write_flag(false),
    version_flag(false), help_flag(false), stereo_image_flag(false), number_width(6),
    start_frame(0), duration(0xffffffff), duration_flag(false), j2c_pedantic(true),
    picture_rate(24), fb_size(FRAME_BUFFER_SIZE), file_prefix(0),
    channel_fmt(PCM::CF_NONE), input_filename(0), extension("dcdata")
  {
    memset(key_value, 0, KeyLen);
    memset(key_id_value, 0, UUIDlen);

    for ( int i = 1; i < argc; ++i )
      {

	if ( (strcmp( argv[i], "-help") == 0) )
	  {
	    help_flag = true;
	    continue;
	  }

	if ( argv[i][0] == '-'
	     && ( isalpha(argv[i][1]) || isdigit(argv[i][1]) )
	     && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case '1': mono_wav = true; break;
	      case '2': split_wav = true; break;
	      case '3': stereo_image_flag = true; break;

	      case 'b':
		TEST_EXTRA_ARG(i, 'b');
		fb_size = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'd':
		TEST_EXTRA_ARG(i, 'd');
		duration_flag = true;
		duration = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'e':
		TEST_EXTRA_ARG(i, 'e');
		extension = argv[i];
		break;

	      case 'f':
		TEST_EXTRA_ARG(i, 'f');
		start_frame = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'G': mode = MMT_GOP_START; break;
	      case 'h': help_flag = true; break;

	      case 'k': key_flag = true;
		TEST_EXTRA_ARG(i, 'k');
		{
		  ui32_t length;
		  Kumu::hex2bin(argv[i], key_value, KeyLen, &length);

		  if ( length != KeyLen )
		    {
		      fprintf(stderr, "Unexpected key length: %u, expecting %u characters.\n", length, KeyLen);
		      return;
		    }
		}
		break;

	      case 'm': read_hmac = true; break;

	      case 'p':
		TEST_EXTRA_ARG(i, 'p');
		picture_rate = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 's':
		TEST_EXTRA_ARG(i, 's');
		fb_dump_size = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'V': version_flag = true; break;
	      case 'v': verbose_flag = true; break;
	      case 'W': no_write_flag = true; break;

	      case 'w':
		TEST_EXTRA_ARG(i, 'w');
		number_width = Kumu::xabs(strtol(argv[i], 0, 10));
		break;

	      case 'Z': j2c_pedantic = false; break;
	      case 'z': j2c_pedantic = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {
	    if ( argv[i][0] != '-' )
	      {
		if ( input_filename == 0 )
		  {
		    input_filename = argv[i];
		  }
		else if ( file_prefix == 0 )
		  {
		    file_prefix = argv[i];
		  }
	      }
	    else
	      {
		fprintf(stderr, "Unrecognized argument: %s\n", argv[i]);
		return;
	      }
	  }
      }

    if ( help_flag || version_flag )
      return;

    if ( (  mode == MMT_EXTRACT || mode == MMT_GOP_START ) && input_filename == 0 )
      {
	fputs("Option requires at least one filename argument.\n", stderr);
	return;
      }

    if ( mode == MMT_EXTRACT  && file_prefix == 0 )
      {
	prefix_buffer = Kumu::PathSetExtension(input_filename, "") + "_";
	file_prefix = prefix_buffer.c_str();
      }

    error_flag = false;
  }